

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

PICK_MODE_CONTEXT *
av1_alloc_pmc(AV1_COMP *cpi,BLOCK_SIZE bsize,PC_TREE_SHARED_BUFFERS *shared_bufs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint16_t *puVar5;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  int i_1;
  int i;
  int num_blk;
  int num_pix;
  int num_planes;
  aom_internal_error_info error;
  AV1_COMMON *cm;
  PICK_MODE_CONTEXT *ctx;
  int in_stack_fffffffffffffe0c;
  size_t in_stack_fffffffffffffe10;
  PICK_MODE_CONTEXT *ctx_00;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar6;
  int iVar7;
  __jmp_buf_tag _Stack_f8;
  AV1_COMMON *local_30;
  PICK_MODE_CONTEXT *local_28;
  long local_20;
  byte local_11;
  PICK_MODE_CONTEXT *local_8;
  
  local_28 = (PICK_MODE_CONTEXT *)0x0;
  local_30 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_20 = in_RDX;
  local_11 = in_SIL;
  iVar1 = _setjmp(&_Stack_f8);
  if (iVar1 == 0) {
    local_28 = (PICK_MODE_CONTEXT *)
               aom_calloc(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                          in_stack_fffffffffffffe10);
    if (local_28 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate ctx");
    }
    local_28->rd_mode_is_ready = 0;
    iVar1 = av1_num_planes(local_30);
    uVar2 = (uint)block_size_wide[local_11] * (uint)block_size_high[local_11];
    uVar3 = uVar2 / 0x10;
    puVar4 = (uint8_t *)
             aom_calloc(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        in_stack_fffffffffffffe10);
    local_28->blk_skip = puVar4;
    if (local_28->blk_skip == (uint8_t *)0x0) {
      aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate ctx->blk_skip");
    }
    puVar4 = (uint8_t *)
             aom_calloc(CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        in_stack_fffffffffffffe10);
    local_28->tx_type_map = puVar4;
    if (local_28->tx_type_map == (uint8_t *)0x0) {
      aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate ctx->tx_type_map");
    }
    local_28->num_4x4_blk = uVar3;
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      local_28->coeff[iVar7] = *(tran_low_t **)(local_20 + (long)iVar7 * 8);
      local_28->qcoeff[iVar7] = *(tran_low_t **)(local_20 + 0x18 + (long)iVar7 * 8);
      local_28->dqcoeff[iVar7] = *(tran_low_t **)(local_20 + 0x30 + (long)iVar7 * 8);
      puVar5 = (uint16_t *)aom_memalign(CONCAT44(iVar1,uVar2),CONCAT44(uVar3,iVar7));
      local_28->eobs[iVar7] = puVar5;
      if (local_28->eobs[iVar7] == (uint16_t *)0x0) {
        aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate ctx->eobs[i]");
      }
      puVar4 = (uint8_t *)aom_memalign(CONCAT44(iVar1,uVar2),CONCAT44(uVar3,iVar7));
      local_28->txb_entropy_ctx[iVar7] = puVar4;
      if (local_28->txb_entropy_ctx[iVar7] == (uint8_t *)0x0) {
        aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate ctx->txb_entropy_ctx[i]");
      }
    }
    if ((int)uVar2 < 0x1001) {
      for (iVar6 = 0; iVar6 < 2; iVar6 = iVar6 + 1) {
        if (((local_30->features).allow_screen_content_tools & 1U) == 0) {
          local_28->color_index_map[iVar6] = (uint8_t *)0x0;
        }
        else {
          puVar4 = (uint8_t *)aom_memalign(CONCAT44(iVar1,uVar2),CONCAT44(uVar3,iVar7));
          local_28->color_index_map[iVar6] = puVar4;
          if (local_28->color_index_map[iVar6] == (uint8_t *)0x0) {
            aom_internal_error((aom_internal_error_info *)&stack0xfffffffffffffe30,
                               AOM_CODEC_MEM_ERROR,"Failed to allocate ctx->color_index_map[i]");
          }
        }
      }
    }
    av1_invalid_rd_stats(&local_28->rd_stats);
    local_8 = local_28;
  }
  else {
    ctx_00 = local_28;
    av1_num_planes(local_30);
    av1_free_pmc(ctx_00,in_stack_fffffffffffffe0c);
    local_8 = (PICK_MODE_CONTEXT *)0x0;
  }
  return local_8;
}

Assistant:

PICK_MODE_CONTEXT *av1_alloc_pmc(const struct AV1_COMP *const cpi,
                                 BLOCK_SIZE bsize,
                                 PC_TREE_SHARED_BUFFERS *shared_bufs) {
  PICK_MODE_CONTEXT *volatile ctx = NULL;
  const AV1_COMMON *const cm = &cpi->common;
  struct aom_internal_error_info error;

  if (setjmp(error.jmp)) {
    av1_free_pmc(ctx, av1_num_planes(cm));
    return NULL;
  }
  error.setjmp = 1;

  AOM_CHECK_MEM_ERROR(&error, ctx, aom_calloc(1, sizeof(*ctx)));
  ctx->rd_mode_is_ready = 0;

  const int num_planes = av1_num_planes(cm);
  const int num_pix = block_size_wide[bsize] * block_size_high[bsize];
  const int num_blk = num_pix / 16;

  AOM_CHECK_MEM_ERROR(&error, ctx->blk_skip,
                      aom_calloc(num_blk, sizeof(*ctx->blk_skip)));
  AOM_CHECK_MEM_ERROR(&error, ctx->tx_type_map,
                      aom_calloc(num_blk, sizeof(*ctx->tx_type_map)));
  ctx->num_4x4_blk = num_blk;

  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = shared_bufs->coeff_buf[i];
    ctx->qcoeff[i] = shared_bufs->qcoeff_buf[i];
    ctx->dqcoeff[i] = shared_bufs->dqcoeff_buf[i];
    AOM_CHECK_MEM_ERROR(&error, ctx->eobs[i],
                        aom_memalign(32, num_blk * sizeof(*ctx->eobs[i])));
    AOM_CHECK_MEM_ERROR(
        &error, ctx->txb_entropy_ctx[i],
        aom_memalign(32, num_blk * sizeof(*ctx->txb_entropy_ctx[i])));
  }

  if (num_pix <= MAX_PALETTE_SQUARE) {
    for (int i = 0; i < 2; ++i) {
      if (cm->features.allow_screen_content_tools) {
        AOM_CHECK_MEM_ERROR(
            &error, ctx->color_index_map[i],
            aom_memalign(32, num_pix * sizeof(*ctx->color_index_map[i])));
      } else {
        ctx->color_index_map[i] = NULL;
      }
    }
  }

  av1_invalid_rd_stats(&ctx->rd_stats);

  return ctx;
}